

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mwt.cc
# Opt level: O2

void MWT::value_policy(mwt *c,float val,uint64_t index)

{
  vw *pvVar1;
  uint64_t *puVar2;
  ostream *poVar3;
  policy_data *ppVar4;
  uint32_t *puVar5;
  float fVar6;
  uint64_t new_index;
  ulong local_18;
  
  fVar6 = floorf(val);
  if (0.0 <= val) {
    if ((fVar6 == val) && (!NAN(fVar6) && !NAN(val))) goto LAB_001978dd;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"error ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,val);
  poVar3 = std::operator<<(poVar3," is not a valid action ");
  std::endl<char,std::char_traits<char>>(poVar3);
LAB_001978dd:
  pvVar1 = c->all;
  puVar5 = &(pvVar1->weights).dense_weights._stride_shift;
  puVar2 = &(pvVar1->weights).dense_weights._weight_mask;
  if ((pvVar1->weights).sparse != false) {
    puVar5 = &(pvVar1->weights).sparse_weights._stride_shift;
    puVar2 = &(pvVar1->weights).sparse_weights._weight_mask;
  }
  local_18 = (index & *puVar2) >> ((byte)*puVar5 & 0x3f);
  ppVar4 = (c->evals)._begin;
  if (ppVar4[local_18].seen == false) {
    ppVar4[local_18].seen = true;
    v_array<unsigned_long>::push_back(&c->policies,&local_18);
    ppVar4 = (c->evals)._begin;
  }
  ppVar4[local_18].action = (uint32_t)(long)val;
  return;
}

Assistant:

void value_policy(mwt& c, float val, uint64_t index)  // estimate the value of a single feature.
{
  if (val < 0 || floor(val) != val)
    cout << "error " << val << " is not a valid action " << endl;

  uint32_t value = (uint32_t)val;
  uint64_t new_index = (index & c.all->weights.mask()) >> c.all->weights.stride_shift();

  if (!c.evals[new_index].seen)
  {
    c.evals[new_index].seen = true;
    c.policies.push_back(new_index);
  }

  c.evals[new_index].action = value;
}